

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,char *o)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  
  cVar2 = *this->_str;
  bVar4 = cVar2 == *o;
  if (cVar2 != '\0' && bVar4) {
    lVar3 = 1;
    do {
      cVar2 = this->_str[lVar3];
      pcVar1 = o + lVar3;
      bVar4 = cVar2 == *pcVar1;
      if (cVar2 == '\0') {
        return bVar4;
      }
      lVar3 = lVar3 + 1;
    } while (cVar2 == *pcVar1);
  }
  return bVar4;
}

Assistant:

bool CStrT<CharT>::operator==(const CharT* o)const
{
    const CharT* a = _str;
    const CharT* b = o;
    while(true) {
        if(*a != *b)
            return false;
        if(*a == 0)
            return true;
        a++;
        b++;
    }
}